

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorToolset
          (cmGlobalGhsMultiGenerator *this,string *ts,bool build,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  cmValue c2;
  size_type *psVar4;
  undefined7 in_register_00000011;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view value;
  string gbuild;
  string tsp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined8 local_f0;
  size_type local_e8;
  pointer local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined1 **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  bVar2 = true;
  if ((int)CONCAT71(in_register_00000011,build) == 0) {
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    GetToolset(this,mf,&local_188,ts);
    if (local_188._M_string_length == 0) {
      bVar2 = false;
    }
    else {
      paVar1 = &local_148.field_2;
      local_148._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_188._M_dataplus._M_p,
                 local_188._M_dataplus._M_p + local_188._M_string_length);
      std::__cxx11::string::append((char *)&local_148);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_148);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_1a8.field_2._M_allocated_capacity = *psVar4;
        local_1a8.field_2._8_8_ = plVar3[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar4;
        local_1a8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_1a8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      local_148._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"CMAKE_MAKE_PROGRAM","");
      c2 = cmMakefile::GetDefinition(mf,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (((c2.Value == (string *)0x0) || ((c2.Value)->_M_string_length == 0)) ||
         (bVar2 = cmsys::SystemTools::ComparePath(&local_1a8,c2.Value), bVar2)) {
        local_148._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"CMAKE_MAKE_PROGRAM","");
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"build program to use","");
        cmMakefile::AddCacheDefinition(mf,&local_148,&local_1a8,(string *)&local_a0,INTERNAL,true);
        if (local_a0 != &local_90) {
          operator_delete(local_a0,(ulong)(local_90 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        local_148._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,"CMAKE_SYSTEM_VERSION","");
        value._M_str = local_188._M_dataplus._M_p;
        value._M_len = local_188._M_string_length;
        cmMakefile::AddDefinition(mf,&local_148,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        bVar2 = true;
      }
      else {
        local_148._M_dataplus._M_p = &DAT_00000014;
        local_148._M_string_length = 0x94bd68;
        local_148.field_2._M_allocated_capacity = 0;
        local_148.field_2._8_8_ = local_1a8._M_string_length;
        local_128 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p;
        local_120 = 0;
        local_110 = local_88;
        local_a0 = (undefined1 **)0x0;
        local_98 = 1;
        local_88[0] = 10;
        local_118 = 1;
        local_108 = 0;
        local_100 = 0x2f;
        local_f8 = "Does not match the previously used build tool: ";
        local_f0 = 0;
        local_e0 = ((c2.Value)->_M_dataplus)._M_p;
        local_e8 = (c2.Value)->_M_string_length;
        local_d8 = 0;
        local_c8 = local_50;
        local_68 = 0;
        local_60 = 1;
        local_50[0] = 10;
        local_d0 = 1;
        local_c0 = 0;
        local_b8 = 0x66;
        local_b0 = 
        "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
        ;
        local_a8 = 0;
        views._M_len = 7;
        views._M_array = (iterator)&local_148;
        local_90 = local_110;
        local_58 = local_c8;
        cmCatViews(&local_168,views);
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,
                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                               local_188.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorToolset(std::string const& ts,
                                                    bool build, cmMakefile* mf)
{
  /* In build mode nothing to be done.
   * Toolset already determined and build tool absolute path is cached.
   */
  if (build) {
    return true;
  }

  /* Determine the absolute directory for the toolset */
  std::string tsp;
  this->GetToolset(mf, tsp, ts);

  /* no toolset was found */
  if (tsp.empty()) {
    return false;
  }

  /* set the build tool to use */
  std::string gbuild(tsp + ((tsp.back() == '/') ? "" : "/") +
                     DEFAULT_BUILD_PROGRAM);
  cmValue prevTool = mf->GetDefinition("CMAKE_MAKE_PROGRAM");

  /* check if the toolset changed from last generate */
  if (cmNonempty(prevTool) && !cmSystemTools::ComparePath(gbuild, *prevTool)) {
    std::string const& e = cmStrCat(
      "toolset build tool: ", gbuild, '\n',
      "Does not match the previously used build tool: ", *prevTool, '\n',
      "Either remove the CMakeCache.txt file and CMakeFiles "
      "directory or choose a different binary directory.");
    mf->IssueMessage(MessageType::FATAL_ERROR, e);
    return false;
  }

  /* store the toolset that is being used for this build */
  mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", gbuild, "build program to use",
                         cmStateEnums::INTERNAL, true);

  mf->AddDefinition("CMAKE_SYSTEM_VERSION", tsp);

  return true;
}